

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O0

void __thiscall
luna::Exception::SetWhat<char_const*&,char,char_const*,char_const(&)[7],char_const*>
          (Exception *this,ostringstream *oss,char **arg,char *args,char **args_1,char (*args_2) [7]
          ,char **args_3)

{
  char *in_RCX;
  ostringstream *in_RDX;
  ostream *in_RSI;
  char **in_RDI;
  char **in_R8;
  char (*in_R9) [7];
  
  std::operator<<(in_RSI,*(char **)in_RDX);
  SetWhat<char,char_const*,char_const(&)[7],char_const*>
            ((Exception *)in_RSI,in_RDX,in_RCX,in_R8,in_R9,in_RDI);
  return;
}

Assistant:

void SetWhat(std::ostringstream &oss, Arg&& arg, Args&&... args)
        {
            oss << std::forward<Arg>(arg);
            SetWhat(oss, std::forward<Args>(args)...);
        }